

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

void vk::BinaryRegistryDetail::anon_unknown_8::normalizeSparseIndex(SparseIndexNode *group)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference ppSVar5;
  reference __b;
  SparseIndexNode *this;
  vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  *pvVar6;
  SparseIndexNode *local_28;
  ulong local_20;
  size_t childNdx;
  SparseIndexNode *pSStack_10;
  int zeroChildPos;
  SparseIndexNode *group_local;
  
  childNdx._4_4_ = -1;
  pSStack_10 = group;
  for (local_20 = 0; uVar1 = local_20,
      sVar4 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::size(&pSStack_10->children), uVar1 < sVar4; local_20 = local_20 + 1) {
    ppSVar5 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::operator[](&pSStack_10->children,local_20);
    normalizeSparseIndex(*ppSVar5);
    ppSVar5 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::operator[](&pSStack_10->children,local_20);
    if ((*ppSVar5)->word == 0) {
      childNdx._4_4_ = (int)local_20;
    }
  }
  if (childNdx._4_4_ < 0) {
    bVar3 = std::
            vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ::empty(&pSStack_10->children);
    if (!bVar3) {
      pvVar6 = &pSStack_10->children;
      sVar4 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::size(pvVar6);
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::reserve(pvVar6,sVar4 + 1);
      pvVar6 = &pSStack_10->children;
      this = (SparseIndexNode *)operator_new(0x20);
      SparseIndexNode::SparseIndexNode(this,0,0);
      local_28 = this;
      std::
      vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
      ::push_back(pvVar6,&local_28);
    }
  }
  else {
    for (; iVar2 = childNdx._4_4_,
        sVar4 = std::
                vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ::size(&pSStack_10->children), iVar2 != (int)sVar4 + -1;
        childNdx._4_4_ = childNdx._4_4_ + 1) {
      ppSVar5 = std::
                vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ::operator[](&pSStack_10->children,(long)childNdx._4_4_);
      __b = std::
            vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
            ::operator[](&pSStack_10->children,(long)(childNdx._4_4_ + 1));
      std::swap<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode*>(ppSVar5,__b);
    }
  }
  return;
}

Assistant:

void normalizeSparseIndex (SparseIndexNode* group)
{
	int		zeroChildPos	= -1;

	for (size_t childNdx = 0; childNdx < group->children.size(); childNdx++)
	{
		normalizeSparseIndex(group->children[childNdx]);

		if (group->children[childNdx]->word == 0)
		{
			DE_ASSERT(zeroChildPos < 0);
			zeroChildPos = (int)childNdx;
		}
	}

	if (zeroChildPos >= 0)
	{
		// Move child with word = 0 to last
		while (zeroChildPos != (int)group->children.size()-1)
		{
			std::swap(group->children[zeroChildPos], group->children[zeroChildPos+1]);
			zeroChildPos += 1;
		}
	}
	else if (!group->children.empty())
	{
		group->children.reserve(group->children.size()+1);
		group->children.push_back(new SparseIndexNode(0, 0));
	}
}